

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

Array<asl::Map<asl::String,_int>::KeyVal> * __thiscall
asl::Array<asl::Map<asl::String,_int>::KeyVal>::insert
          (Array<asl::Map<asl::String,_int>::KeyVal> *this,int k,KeyVal *x)

{
  int iVar1;
  int iVar2;
  int iVar3;
  KeyVal *pKVar4;
  int *piVar5;
  undefined8 *puVar6;
  int iVar7;
  anon_union_16_2_78e7fdac_for_String_2 *__src;
  anon_union_16_2_78e7fdac_for_String_2 *__dest;
  int iVar8;
  
  pKVar4 = this->_a;
  iVar1 = *(int *)((long)&pKVar4[-1].key.field_2 + 8);
  iVar2 = *(int *)((long)&pKVar4[-1].key.field_2 + 0xc);
  iVar7 = k;
  if (k < 0) {
    iVar7 = iVar1;
  }
  if (iVar1 < iVar2) {
    piVar5 = (int *)((long)&pKVar4[-1].key.field_2 + 8);
LAB_00139c09:
    if (iVar1 - iVar7 != 0 && iVar7 <= iVar1) {
      memmove(this->_a + (long)iVar7 + 1,this->_a + iVar7,(long)(iVar1 - iVar7) << 5);
    }
    pKVar4 = this->_a;
    iVar2 = (x->key)._len;
    String::alloc(&pKVar4[iVar7].key,iVar2);
    pKVar4[iVar7].key._len = iVar2;
    if (pKVar4[iVar7].key._size == 0) {
      __dest = &pKVar4[iVar7].key.field_2;
    }
    else {
      __dest = (anon_union_16_2_78e7fdac_for_String_2 *)pKVar4[iVar7].key.field_2._str;
    }
    if ((x->key)._size == 0) {
      __src = &(x->key).field_2;
    }
    else {
      __src = (anon_union_16_2_78e7fdac_for_String_2 *)(x->key).field_2._str;
    }
    memcpy(__dest,__src,(long)iVar2 + 1);
    pKVar4[iVar7].value = x->value;
    *piVar5 = iVar1 + 1;
    return this;
  }
  if (iVar1 != 0x7fffffff) {
    dup(this,k);
    iVar3 = this->_a[-1].value;
    iVar8 = 0x7fffffff;
    if (iVar2 < 0x3ffffffe) {
      iVar8 = iVar2 * 2 + 2;
    }
    piVar5 = (int *)realloc((void *)((long)&this->_a[-1].key.field_2 + 8),(long)iVar8 << 5 | 0x10);
    if (piVar5 != (int *)0x0) {
      this->_a = (KeyVal *)(piVar5 + 4);
      piVar5[1] = iVar8;
      piVar5[2] = iVar3;
      goto LAB_00139c09;
    }
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = dup2;
  __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

Array<T>& Array<T>::insert(int k, const T& x)
{
	Data* h = &d();
	int n = h->n;
	int s = h->s;
	if (k < 0)
		k = n;
	if (n < s) {}
	else
	{
		s++;
		if (n == 2147483647)
			ASL_BAD_ALLOC();
		dup();
		int rc = d().rc;
		ASL_RC_FREE();
		int s1 = s < 1073741823 ? 2 * s : 2147483647;
		char* p = (char*)realloc((char*)_a - sizeof(Data), s1 * sizeof(T) + sizeof(Data));
		if(!p)
			ASL_BAD_ALLOC();
		T* b = (T*) ( p + sizeof(Data) );
		_a = b;
		ASL_RC_INIT();
		h = &d();
		h->s=s1;
		h->rc = rc;
	}
	if (k < n) {
		memmove((char*)(_a + k + 1), (char*)(_a + k), (n - k) * sizeof(T));
	}
	asl_construct_copy(_a + k, x);
	h->n = n+1;
	return *this;
}